

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

uint64_t get_filt_error(CdefSearchCtx *cdef_search_ctx,macroblockd_plane *pd,cdef_list *dlist,
                       int (*dir) [16],int *dirinit,int (*var) [16],uint16_t *in,uint8_t *ref_buffer
                       ,int ref_stride,int row,int col,int pri_strength,int sec_strength,
                       int cdef_count,int pli,int coeff_shift,BLOCK_SIZE bs)

{
  _func_int64_t_uint8_t_ptr_int_uint8_t_ptr_int_int_int *p_Var1;
  short sVar2;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  int64_t iVar7;
  long lVar8;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int iVar9;
  uint16_t tmp_dst [16384];
  int tmp_buf_offset;
  int buf_offset_2;
  FULLPEL_MV tmp_buf_pos;
  FULLPEL_MV this_mv_2;
  int16_t bx_pos_1;
  int16_t by_pos_1;
  uint8_t bx_1;
  uint8_t by_1;
  int bi_1;
  int num_error_calc_filt_units_1;
  uint8_t tmp_dst8_1 [16384];
  int buf_offset_1;
  FULLPEL_MV this_mv_1;
  int16_t bx_pos;
  int16_t by_pos;
  uint8_t bx;
  uint8_t by;
  int bi;
  int num_error_calc_filt_units;
  uint8_t tmp_dst8 [16384];
  int buf_offset;
  FULLPEL_MV this_mv;
  int tot_blk_count;
  int bh_log2;
  int bw_log2;
  BLOCK_SIZE plane_bsize;
  uint64_t curr_sse;
  FULLPEL_MV *in_stack_fffffffffffefe00;
  buf_2d *in_stack_fffffffffffefe08;
  undefined4 uVar10;
  int iVar11;
  undefined1 auStack_10140 [112];
  int in_stack_fffffffffffeff30;
  int in_stack_fffffffffffeff34;
  uint16_t *in_stack_fffffffffffeff38;
  int in_stack_fffffffffffeff44;
  uint16_t *in_stack_fffffffffffeff48;
  uint8_t *in_stack_fffffffffffeff50;
  int (*in_stack_fffffffffffeff78) [16];
  int *in_stack_fffffffffffeff80;
  int (*in_stack_fffffffffffeff88) [16];
  int in_stack_fffffffffffeff90;
  cdef_list *in_stack_fffffffffffeff98;
  int in_stack_fffffffffffeffa0;
  int in_stack_fffffffffffeffa8;
  int in_stack_fffffffffffeffb0;
  int in_stack_fffffffffffeffb8;
  int in_stack_fffffffffffeffc0;
  FULLPEL_MV local_8136;
  FULLPEL_MV local_8132;
  short local_812e;
  short local_812c;
  byte local_812a;
  byte local_8129;
  int local_8128;
  int local_8124;
  uint8_t local_8120 [16392];
  int local_4118;
  FULLPEL_MV local_4112;
  short local_410e;
  short local_410c;
  byte local_410a;
  byte local_4109;
  int local_4108;
  int local_4104;
  uint8_t local_4100 [16408];
  int local_e8;
  FULLPEL_MV local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  BLOCK_SIZE local_d1;
  uint64_t local_d0;
  long local_b0;
  long local_a8;
  long local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  long local_88;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  long local_68;
  int local_5c;
  short sVar3;
  
  local_d0 = 0;
  local_b0 = in_RDX;
  local_a8 = in_RSI;
  local_a0 = in_RDI;
  local_d1 = get_plane_block_size((BLOCK_SIZE)coeff_shift,*(int *)(in_RSI + 4),*(int *)(in_RSI + 8))
  ;
  local_d8 = 3 - *(int *)(local_a8 + 4);
  local_dc = 3 - *(int *)(local_a8 + 8);
  if ((*(byte *)(local_a0 + 0x1f24) & 1) == 0) {
    local_e0 = (int)((uint)block_size_wide[local_d1] * (uint)block_size_high[local_d1]) >>
               ((char)local_d8 + (char)local_dc & 0x1fU);
    sVar2 = (short)ref_stride;
    sVar3 = (short)row;
    if (sec_strength == local_e0) {
      local_e4.row = sVar2;
      local_e4.col = sVar3;
      local_e8 = get_offset_from_fullmv(&local_e4,(int)ref_buffer);
      p_Var1 = aom_sse;
      if ((col == 0) && (pri_strength == 0)) {
        lVar8 = (long)local_e8;
        puVar6 = get_buf_from_fullmv(in_stack_fffffffffffefe08,in_stack_fffffffffffefe00);
        local_d0 = (*p_Var1)((uint8_t *)((long)in + lVar8),(int)ref_buffer,puVar6,
                             *(int *)(local_a8 + 0x28),(int)block_size_wide[local_d1],
                             (int)block_size_high[local_d1]);
      }
      else {
        av1_cdef_filter_fb(in_stack_fffffffffffeff50,in_stack_fffffffffffeff48,
                           in_stack_fffffffffffeff44,in_stack_fffffffffffeff38,
                           in_stack_fffffffffffeff34,in_stack_fffffffffffeff30,
                           in_stack_fffffffffffeff78,in_stack_fffffffffffeff80,
                           in_stack_fffffffffffeff88,in_stack_fffffffffffeff90,
                           in_stack_fffffffffffeff98,in_stack_fffffffffffeffa0,
                           in_stack_fffffffffffeffa8,in_stack_fffffffffffeffb0,
                           in_stack_fffffffffffeffb8,in_stack_fffffffffffeffc0);
        local_d0 = (*aom_sse)((uint8_t *)((long)in + (long)local_e8),(int)ref_buffer,local_4100,0x80
                              ,(int)block_size_wide[local_d1],(int)block_size_high[local_d1]);
      }
    }
    else if ((col == 0) && (pri_strength == 0)) {
      local_4104 = 1;
      for (local_4108 = 0; local_4108 < sec_strength; local_4108 = local_4108 + local_4104) {
        local_4109 = *(byte *)(local_b0 + (long)local_4108 * 2);
        local_410a = *(byte *)(local_b0 + 1 + (long)local_4108 * 2);
        local_410c = (ushort)local_4109 << ((byte)local_dc & 0x1f);
        local_410e = (ushort)local_410a << ((byte)local_d8 & 0x1f);
        local_4112.row = sVar2 + local_410c;
        local_4112.col = sVar3 + local_410e;
        local_4118 = get_offset_from_fullmv(&local_4112,(int)ref_buffer);
        p_Var1 = aom_sse;
        local_74 = *(int *)(local_a8 + 4);
        local_78 = *(int *)(local_a8 + 8);
        local_68 = local_b0;
        local_6c = sec_strength;
        local_70 = local_4108;
        if (local_74 == local_78) {
          if (((local_4108 + 3 < sec_strength) &&
              (*(char *)(local_b0 + (long)local_4108 * 2) ==
               *(char *)(local_b0 + (long)(local_4108 + 3) * 2))) &&
             (*(byte *)(local_b0 + 1 + (long)local_4108 * 2) + 3 ==
              (uint)*(byte *)(local_b0 + 1 + (long)(local_4108 + 3) * 2))) {
            local_5c = 4;
          }
          else if (((local_4108 + 1 < sec_strength) &&
                   (*(char *)(local_b0 + (long)local_4108 * 2) ==
                    *(char *)(local_b0 + (long)(local_4108 + 1) * 2))) &&
                  (*(byte *)(local_b0 + 1 + (long)local_4108 * 2) + 1 ==
                   (uint)*(byte *)(local_b0 + 1 + (long)(local_4108 + 1) * 2))) {
            local_5c = 2;
          }
          else {
            local_5c = 1;
          }
        }
        else {
          local_5c = 1;
        }
        local_4104 = local_5c;
        lVar8 = (long)local_4118;
        puVar6 = get_buf_from_fullmv(in_stack_fffffffffffefe08,in_stack_fffffffffffefe00);
        iVar7 = (*p_Var1)((uint8_t *)((long)in + lVar8),(int)ref_buffer,puVar6,
                          *(int *)(local_a8 + 0x28),local_4104 * (1 << ((byte)local_d8 & 0x1f)),
                          1 << ((byte)local_dc & 0x1f));
        local_d0 = iVar7 + local_d0;
      }
    }
    else {
      av1_cdef_filter_fb(in_stack_fffffffffffeff50,in_stack_fffffffffffeff48,
                         in_stack_fffffffffffeff44,in_stack_fffffffffffeff38,
                         in_stack_fffffffffffeff34,in_stack_fffffffffffeff30,
                         in_stack_fffffffffffeff78,in_stack_fffffffffffeff80,
                         in_stack_fffffffffffeff88,in_stack_fffffffffffeff90,
                         in_stack_fffffffffffeff98,in_stack_fffffffffffeffa0,
                         in_stack_fffffffffffeffa8,in_stack_fffffffffffeffb0,
                         in_stack_fffffffffffeffb8,in_stack_fffffffffffeffc0);
      local_8124 = 1;
      for (local_8128 = 0; local_8128 < sec_strength; local_8128 = local_8128 + local_8124) {
        local_8129 = *(byte *)(local_b0 + (long)local_8128 * 2);
        local_812a = *(byte *)(local_b0 + 1 + (long)local_8128 * 2);
        local_8136.row = (ushort)local_8129 << ((byte)local_dc & 0x1f);
        local_8136.col = (ushort)local_812a << ((byte)local_d8 & 0x1f);
        local_8132.row = sVar2 + local_8136.row;
        local_8132.col = sVar3 + local_8136.col;
        local_812e = local_8136.col;
        local_812c = local_8136.row;
        iVar4 = get_offset_from_fullmv(&local_8132,(int)ref_buffer);
        iVar5 = get_offset_from_fullmv(&local_8136,0x80);
        local_94 = *(int *)(local_a8 + 4);
        local_98 = *(int *)(local_a8 + 8);
        local_88 = local_b0;
        local_8c = sec_strength;
        local_90 = local_8128;
        if (local_94 == local_98) {
          if (((local_8128 + 3 < sec_strength) &&
              (*(char *)(local_b0 + (long)local_8128 * 2) ==
               *(char *)(local_b0 + (long)(local_8128 + 3) * 2))) &&
             (*(byte *)(local_b0 + 1 + (long)local_8128 * 2) + 3 ==
              (uint)*(byte *)(local_b0 + 1 + (long)(local_8128 + 3) * 2))) {
            local_7c = 4;
          }
          else if (((local_8128 + 1 < sec_strength) &&
                   (*(char *)(local_b0 + (long)local_8128 * 2) ==
                    *(char *)(local_b0 + (long)(local_8128 + 1) * 2))) &&
                  (*(byte *)(local_b0 + 1 + (long)local_8128 * 2) + 1 ==
                   (uint)*(byte *)(local_b0 + 1 + (long)(local_8128 + 1) * 2))) {
            local_7c = 2;
          }
          else {
            local_7c = 1;
          }
        }
        else {
          local_7c = 1;
        }
        local_8124 = local_7c;
        iVar7 = (*aom_sse)((uint8_t *)((long)in + (long)iVar4),(int)ref_buffer,local_8120 + iVar5,
                           0x80,local_7c * (1 << ((byte)local_d8 & 0x1f)),
                           1 << ((byte)local_dc & 0x1f));
        local_d0 = iVar7 + local_d0;
      }
    }
  }
  else {
    iVar9 = pri_strength + (uint)(pri_strength == 3);
    uVar10 = *(undefined4 *)(local_a0 + 0x1eb8);
    iVar4 = cdef_count;
    lVar8 = local_b0;
    iVar5 = sec_strength;
    iVar11 = pli;
    av1_cdef_filter_fb(in_stack_fffffffffffeff50,in_stack_fffffffffffeff48,in_stack_fffffffffffeff44
                       ,in_stack_fffffffffffeff38,in_stack_fffffffffffeff34,
                       in_stack_fffffffffffeff30,in_stack_fffffffffffeff78,in_stack_fffffffffffeff80
                       ,in_stack_fffffffffffeff88,in_stack_fffffffffffeff90,
                       in_stack_fffffffffffeff98,in_stack_fffffffffffeffa0,in_stack_fffffffffffeffa8
                       ,in_stack_fffffffffffeffb0,in_stack_fffffffffffeffb8,
                       in_stack_fffffffffffeffc0);
    local_d0 = (**(code **)(local_a0 + 0x1ea8))
                         (in,(ulong)ref_buffer & 0xffffffff,auStack_10140,local_b0,sec_strength,
                          *(uint *)(local_a0 + 0x1ef4 + (long)cdef_count * 4) & 0xff,pli,ref_stride,
                          row,iVar4,lVar8,iVar5,col,iVar9,uVar10,iVar11);
  }
  return local_d0;
}

Assistant:

static inline uint64_t get_filt_error(
    const CdefSearchCtx *cdef_search_ctx, const struct macroblockd_plane *pd,
    cdef_list *dlist, int dir[CDEF_NBLOCKS][CDEF_NBLOCKS], int *dirinit,
    int var[CDEF_NBLOCKS][CDEF_NBLOCKS], uint16_t *in, uint8_t *ref_buffer,
    int ref_stride, int row, int col, int pri_strength, int sec_strength,
    int cdef_count, int pli, int coeff_shift, BLOCK_SIZE bs) {
  uint64_t curr_sse = 0;
  const BLOCK_SIZE plane_bsize =
      get_plane_block_size(bs, pd->subsampling_x, pd->subsampling_y);
  const int bw_log2 = 3 - pd->subsampling_x;
  const int bh_log2 = 3 - pd->subsampling_y;

  // TODO(Ranjit): Extend this optimization for HBD
  if (!cdef_search_ctx->use_highbitdepth) {
    // If all 8x8/4x4 blocks in CDEF block need to be filtered, calculate the
    // error at CDEF block level
    const int tot_blk_count =
        (block_size_wide[plane_bsize] * block_size_high[plane_bsize]) >>
        (bw_log2 + bh_log2);
    if (cdef_count == tot_blk_count) {
      // Calculate the offset in the buffer based on block position
      const FULLPEL_MV this_mv = { row, col };
      const int buf_offset = get_offset_from_fullmv(&this_mv, ref_stride);
      if (pri_strength == 0 && sec_strength == 0) {
        // When CDEF strength is zero, filtering is not applied. Hence
        // error is calculated between source and unfiltered pixels
        curr_sse =
            aom_sse(&ref_buffer[buf_offset], ref_stride,
                    get_buf_from_fullmv(&pd->dst, &this_mv), pd->dst.stride,
                    block_size_wide[plane_bsize], block_size_high[plane_bsize]);
      } else {
        DECLARE_ALIGNED(32, uint8_t, tmp_dst8[1 << (MAX_SB_SIZE_LOG2 * 2)]);

        av1_cdef_filter_fb(tmp_dst8, NULL, (1 << MAX_SB_SIZE_LOG2), in,
                           cdef_search_ctx->xdec[pli],
                           cdef_search_ctx->ydec[pli], dir, dirinit, var, pli,
                           dlist, cdef_count, pri_strength,
                           sec_strength + (sec_strength == 3),
                           cdef_search_ctx->damping, coeff_shift);
        curr_sse =
            aom_sse(&ref_buffer[buf_offset], ref_stride, tmp_dst8,
                    (1 << MAX_SB_SIZE_LOG2), block_size_wide[plane_bsize],
                    block_size_high[plane_bsize]);
      }
    } else {
      // If few 8x8/4x4 blocks in CDEF block need to be filtered, filtering
      // functions produce 8-bit output and the error is calculated in 8-bit
      // domain
      if (pri_strength == 0 && sec_strength == 0) {
        int num_error_calc_filt_units = 1;
        for (int bi = 0; bi < cdef_count; bi = bi + num_error_calc_filt_units) {
          const uint8_t by = dlist[bi].by;
          const uint8_t bx = dlist[bi].bx;
          const int16_t by_pos = (by << bh_log2);
          const int16_t bx_pos = (bx << bw_log2);
          // Calculate the offset in the buffer based on block position
          const FULLPEL_MV this_mv = { row + by_pos, col + bx_pos };
          const int buf_offset = get_offset_from_fullmv(&this_mv, ref_stride);
          num_error_calc_filt_units = get_error_calc_width_in_filt_units(
              dlist, cdef_count, bi, pd->subsampling_x, pd->subsampling_y);
          curr_sse += aom_sse(
              &ref_buffer[buf_offset], ref_stride,
              get_buf_from_fullmv(&pd->dst, &this_mv), pd->dst.stride,
              num_error_calc_filt_units * (1 << bw_log2), (1 << bh_log2));
        }
      } else {
        DECLARE_ALIGNED(32, uint8_t, tmp_dst8[1 << (MAX_SB_SIZE_LOG2 * 2)]);
        av1_cdef_filter_fb(tmp_dst8, NULL, (1 << MAX_SB_SIZE_LOG2), in,
                           cdef_search_ctx->xdec[pli],
                           cdef_search_ctx->ydec[pli], dir, dirinit, var, pli,
                           dlist, cdef_count, pri_strength,
                           sec_strength + (sec_strength == 3),
                           cdef_search_ctx->damping, coeff_shift);
        int num_error_calc_filt_units = 1;
        for (int bi = 0; bi < cdef_count; bi = bi + num_error_calc_filt_units) {
          const uint8_t by = dlist[bi].by;
          const uint8_t bx = dlist[bi].bx;
          const int16_t by_pos = (by << bh_log2);
          const int16_t bx_pos = (bx << bw_log2);
          // Calculate the offset in the buffer based on block position
          const FULLPEL_MV this_mv = { row + by_pos, col + bx_pos };
          const FULLPEL_MV tmp_buf_pos = { by_pos, bx_pos };
          const int buf_offset = get_offset_from_fullmv(&this_mv, ref_stride);
          const int tmp_buf_offset =
              get_offset_from_fullmv(&tmp_buf_pos, (1 << MAX_SB_SIZE_LOG2));
          num_error_calc_filt_units = get_error_calc_width_in_filt_units(
              dlist, cdef_count, bi, pd->subsampling_x, pd->subsampling_y);
          curr_sse += aom_sse(
              &ref_buffer[buf_offset], ref_stride, &tmp_dst8[tmp_buf_offset],
              (1 << MAX_SB_SIZE_LOG2),
              num_error_calc_filt_units * (1 << bw_log2), (1 << bh_log2));
        }
      }
    }
  } else {
    DECLARE_ALIGNED(32, uint16_t, tmp_dst[1 << (MAX_SB_SIZE_LOG2 * 2)]);

    av1_cdef_filter_fb(NULL, tmp_dst, CDEF_BSTRIDE, in,
                       cdef_search_ctx->xdec[pli], cdef_search_ctx->ydec[pli],
                       dir, dirinit, var, pli, dlist, cdef_count, pri_strength,
                       sec_strength + (sec_strength == 3),
                       cdef_search_ctx->damping, coeff_shift);
    curr_sse = cdef_search_ctx->compute_cdef_dist_fn(
        ref_buffer, ref_stride, tmp_dst, dlist, cdef_count,
        cdef_search_ctx->bsize[pli], coeff_shift, row, col);
  }
  return curr_sse;
}